

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void __thiscall Buffer::Buffer(Buffer *this,string *path,EndianessMode _endianess)

{
  size_t sVar1;
  void *pvVar2;
  ExceptionFreeserf *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream file;
  int aiStack_208 [122];
  
  (this->super_enable_shared_from_this<Buffer>)._M_weak_this.
  super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Buffer>)._M_weak_this.
  super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Buffer = (_func_int **)&PTR__MutableBuffer_00152b58;
  this->owned = true;
  (this->parent).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->parent).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->endianess = _endianess;
  std::ifstream::ifstream(&file,(path->_M_dataplus)._M_p,_S_bin|_S_ate);
  if (*(int *)((long)aiStack_208 + *(long *)(_file + -0x18)) != 0) {
    pEVar3 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::operator+(&local_248,"Failed to open file \'",path);
    std::operator+(&bStack_268,&local_248,"\'");
    ExceptionFreeserf::ExceptionFreeserf(pEVar3,&bStack_268);
    __cxa_throw(pEVar3,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  sVar1 = std::istream::tellg();
  this->size = sVar1;
  std::istream::seekg((long)&file,_S_beg);
  pvVar2 = malloc(this->size);
  this->data = pvVar2;
  if (pvVar2 != (void *)0x0) {
    std::istream::read((char *)&file,(long)pvVar2);
    std::ifstream::close();
    this->read = (uint8_t *)this->data;
    std::ifstream::~ifstream(&file);
    return;
  }
  pEVar3 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_268,"Failed to allocate memory",(allocator<char> *)&local_248);
  ExceptionFreeserf::ExceptionFreeserf(pEVar3,&bStack_268);
  __cxa_throw(pEVar3,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

Buffer::Buffer(const std::string &path, EndianessMode _endianess)
  : owned(true)
  , endianess(_endianess) {
  std::ifstream file(path.c_str(), std::ios::binary | std::ios::ate);
  if (!file.good()) {
    throw ExceptionFreeserf("Failed to open file '" + path + "'");
  }

  size = size_t(file.tellg());

  file.seekg(0, file.beg);

  data = ::malloc(size);
  if (data == nullptr) {
    throw ExceptionFreeserf("Failed to allocate memory");
  }

  file.read(reinterpret_cast<char*>(data), size);
  file.close();

  read = reinterpret_cast<uint8_t*>(data);
}